

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl.c
# Opt level: O0

void QDLDL_Lsolve(QDLDL_int n,QDLDL_int *Lp,QDLDL_int *Li,QDLDL_float *Lx,QDLDL_float *x)

{
  QDLDL_int j;
  QDLDL_int i;
  QDLDL_float *x_local;
  QDLDL_float *Lx_local;
  QDLDL_int *Li_local;
  QDLDL_int *Lp_local;
  QDLDL_int n_local;
  
  for (i = 0; i < n; i = i + 1) {
    for (j = Lp[i]; j < Lp[i + 1]; j = j + 1) {
      x[Li[j]] = -Lx[j] * x[i] + x[Li[j]];
    }
  }
  return;
}

Assistant:

void QDLDL_Lsolve(const QDLDL_int    n,
                  const QDLDL_int*   Lp,
                  const QDLDL_int*   Li,
                  const QDLDL_float* Lx,
                  QDLDL_float* x){

QDLDL_int i,j;
  for(i = 0; i < n; i++){
      for(j = Lp[i]; j < Lp[i+1]; j++){
          x[Li[j]] -= Lx[j]*x[i];
      }
  }
}